

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceRange __thiscall
slang::SourceManager::getExpansionRange(SourceManager *this,SourceLocation location)

{
  SourceRange SVar1;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  SVar1 = getExpansionRangeImpl<std::shared_lock<std::shared_mutex>_>(this,location,&local_28);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  return SVar1;
}

Assistant:

SourceRange SourceManager::getExpansionRange(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    return getExpansionRangeImpl(location, lock);
}